

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.hpp
# Opt level: O2

void boost::deflate::detail::crc32_integral<unsigned_int,4>(uint v,uint32_t *crc)

{
  uint uVar1;
  uchar *puVar2;
  long lVar3;
  array<unsigned_char,_4UL> arr;
  
  puVar2 = arr._M_elems;
  for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 8) {
    *puVar2 = (char)(v >> ((byte)lVar3 & 0x1f));
    puVar2 = puVar2 + 1;
  }
  uVar1 = crc32(arr._M_elems,4,*crc);
  *crc = uVar1;
  return;
}

Assistant:

void crc32_integral(T v, std::uint32_t& crc) {
    static_assert(std::is_integral<T>::value, "T must be an integral type");
    std::array<unsigned char, I> arr;
    for(int i = 0; i < I; ++i)
        arr[i] = (v >> (i * 8));
    crc = crc32(arr.data(), I, crc);
}